

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::emit_copy_logical_type
          (CompilerGLSL *this,uint32_t lhs_id,uint32_t lhs_type_id,uint32_t rhs_id,
          uint32_t rhs_type_id,SmallVector<unsigned_int,_8UL> *chain)

{
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *puVar1;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *puVar2;
  uint32_t uVar3;
  size_t sVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  SPIRType *type;
  SPIRExpression *pSVar7;
  uint uVar8;
  ulong uVar9;
  __hashtable *__h;
  __hashtable *__h_1;
  __node_gen_type __node_gen;
  AccessChainMeta rhs_meta;
  AccessChainMeta lhs_meta;
  string rhs;
  string lhs;
  uint32_t local_14c;
  uint32_t local_148;
  uint32_t local_144;
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_140;
  uint local_134;
  ulong local_130;
  CompilerGLSL *local_128;
  uint32_t local_11c;
  SPIRType *local_118;
  SPIRType *local_110;
  AccessChainMeta local_108;
  AccessChainMeta local_f8;
  SmallVector<unsigned_int,_8UL> local_e8;
  SmallVector<unsigned_int,_8UL> local_a8;
  string local_70;
  string local_50;
  
  local_14c = rhs_id;
  local_148 = lhs_id;
  local_134 = rhs_type_id;
  local_11c = lhs_type_id;
  type = Variant::get<spirv_cross::SPIRType>
                   ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                    lhs_type_id);
  local_110 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                         local_134);
  local_128 = this;
  local_118 = type;
  if ((type->array).super_VectorView<unsigned_int>.buffer_size == 0) {
    if (*(int *)&(type->super_IVariant).field_0xc == 0xf) {
      SmallVector<unsigned_int,_8UL>::reserve
                (chain,(chain->super_VectorView<unsigned_int>).buffer_size + 1);
      sVar4 = (chain->super_VectorView<unsigned_int>).buffer_size;
      (chain->super_VectorView<unsigned_int>).ptr[sVar4] = 0;
      (chain->super_VectorView<unsigned_int>).buffer_size = sVar4 + 1;
      local_130 = (ulong)(uint)(type->member_types).
                               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                               buffer_size;
      if (local_130 != 0) {
        uVar9 = 0;
        do {
          uVar5 = local_14c;
          (chain->super_VectorView<unsigned_int>).ptr
          [(chain->super_VectorView<unsigned_int>).buffer_size - 1] = (uint)uVar9;
          local_144 = local_148;
          uVar6 = (type->member_types).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[uVar9].id;
          uVar3 = (local_110->member_types).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[uVar9].id;
          local_e8.super_VectorView<unsigned_int>.buffer_size = 0;
          local_e8.buffer_capacity = 8;
          local_e8.super_VectorView<unsigned_int>.ptr = (uint *)&local_e8.stack_storage;
          SmallVector<unsigned_int,_8UL>::operator=(&local_e8,chain);
          emit_copy_logical_type(local_128,local_144,uVar6,uVar5,uVar3,&local_e8);
          local_e8.super_VectorView<unsigned_int>.buffer_size = 0;
          if ((AlignedBuffer<unsigned_int,_8UL> *)local_e8.super_VectorView<unsigned_int>.ptr !=
              &local_e8.stack_storage) {
            free(local_e8.super_VectorView<unsigned_int>.ptr);
          }
          uVar9 = uVar9 + 1;
          type = local_118;
        } while (local_130 != uVar9);
      }
    }
    else {
      local_f8.relaxed_precision = false;
      local_f8.access_meshlet_position_y = false;
      local_f8.storage_physical_type = 0;
      local_f8.need_transpose = false;
      local_f8.storage_is_packed = false;
      local_f8.storage_is_invariant = false;
      local_f8.flattened_struct = false;
      local_108.relaxed_precision = false;
      local_108.access_meshlet_position_y = false;
      local_108.storage_physical_type = 0;
      local_108.need_transpose = false;
      local_108.storage_is_packed = false;
      local_108.storage_is_invariant = false;
      local_108.flattened_struct = false;
      access_chain_internal_abi_cxx11_
                (&local_50,this,local_148,(chain->super_VectorView<unsigned_int>).ptr,
                 (uint32_t)(chain->super_VectorView<unsigned_int>).buffer_size,1,&local_f8);
      access_chain_internal_abi_cxx11_
                (&local_70,this,local_14c,(chain->super_VectorView<unsigned_int>).ptr,
                 (uint32_t)(chain->super_VectorView<unsigned_int>).buffer_size,1,&local_108);
      local_148 = ParsedIR::increase_bound_by(&(this->super_Compiler).ir,2);
      local_14c = local_148 + 1;
      local_140 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                   *)CONCAT71(local_140._1_7_,1);
      pSVar7 = Compiler::set<spirv_cross::SPIRExpression,std::__cxx11::string,unsigned_int&,bool>
                         (&this->super_Compiler,local_148,&local_50,&local_11c,(bool *)&local_140);
      pSVar7->need_transpose = local_f8.need_transpose;
      if (local_f8.storage_is_packed == true) {
        Compiler::set_extended_decoration
                  (&this->super_Compiler,local_148,SPIRVCrossDecorationPhysicalTypePacked,0);
      }
      if (local_f8.storage_physical_type != 0) {
        Compiler::set_extended_decoration
                  (&this->super_Compiler,local_148,SPIRVCrossDecorationPhysicalTypeID,
                   local_f8.storage_physical_type);
      }
      puVar1 = &(this->super_Compiler).forwarded_temporaries;
      local_140 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                   *)puVar1;
      ::std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)puVar1,&local_148);
      puVar2 = &(this->super_Compiler).suppressed_usage_tracking;
      local_140 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                   *)puVar2;
      ::std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)puVar2,&local_148);
      local_140 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                   *)CONCAT71(local_140._1_7_,1);
      pSVar7 = Compiler::set<spirv_cross::SPIRExpression,std::__cxx11::string,unsigned_int&,bool>
                         (&this->super_Compiler,local_14c,&local_70,&local_134,(bool *)&local_140);
      pSVar7->need_transpose = local_108.need_transpose;
      if (local_108.storage_is_packed == true) {
        Compiler::set_extended_decoration
                  (&this->super_Compiler,local_14c,SPIRVCrossDecorationPhysicalTypePacked,0);
      }
      if (local_108.storage_physical_type != 0) {
        Compiler::set_extended_decoration
                  (&this->super_Compiler,local_14c,SPIRVCrossDecorationPhysicalTypeID,
                   local_108.storage_physical_type);
      }
      local_140 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                   *)puVar1;
      ::std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)puVar1,&local_14c);
      local_140 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                   *)puVar2;
      ::std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)puVar2,&local_14c);
      (*(this->super_Compiler)._vptr_Compiler[0x3f])(this,(ulong)local_148,(ulong)local_14c);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
  }
  else {
    uVar6 = to_array_size_literal
                      (this,type,(int)(type->array).super_VectorView<unsigned_int>.buffer_size - 1);
    SmallVector<unsigned_int,_8UL>::reserve
              (chain,(chain->super_VectorView<unsigned_int>).buffer_size + 1);
    sVar4 = (chain->super_VectorView<unsigned_int>).buffer_size;
    (chain->super_VectorView<unsigned_int>).ptr[sVar4] = 0;
    (chain->super_VectorView<unsigned_int>).buffer_size = sVar4 + 1;
    local_130 = CONCAT44(local_130._4_4_,uVar6);
    if (uVar6 != 0) {
      uVar8 = 0;
      do {
        uVar5 = local_14c;
        (chain->super_VectorView<unsigned_int>).ptr
        [(chain->super_VectorView<unsigned_int>).buffer_size - 1] = uVar8;
        local_144 = local_148;
        uVar6 = (type->parent_type).id;
        uVar3 = (local_110->parent_type).id;
        local_a8.super_VectorView<unsigned_int>.buffer_size = 0;
        local_a8.buffer_capacity = 8;
        local_a8.super_VectorView<unsigned_int>.ptr = (uint *)&local_a8.stack_storage;
        SmallVector<unsigned_int,_8UL>::operator=(&local_a8,chain);
        emit_copy_logical_type(local_128,local_144,uVar6,uVar5,uVar3,&local_a8);
        local_a8.super_VectorView<unsigned_int>.buffer_size = 0;
        if ((AlignedBuffer<unsigned_int,_8UL> *)local_a8.super_VectorView<unsigned_int>.ptr !=
            &local_a8.stack_storage) {
          free(local_a8.super_VectorView<unsigned_int>.ptr);
        }
        uVar8 = uVar8 + 1;
        type = local_118;
      } while ((uint)local_130 != uVar8);
    }
  }
  return;
}

Assistant:

void CompilerGLSL::emit_copy_logical_type(uint32_t lhs_id, uint32_t lhs_type_id, uint32_t rhs_id, uint32_t rhs_type_id,
                                          SmallVector<uint32_t> chain)
{
	// Fully unroll all member/array indices one by one.

	auto &lhs_type = get<SPIRType>(lhs_type_id);
	auto &rhs_type = get<SPIRType>(rhs_type_id);

	if (!lhs_type.array.empty())
	{
		// Could use a loop here to support specialization constants, but it gets rather complicated with nested array types,
		// and this is a rather obscure opcode anyways, keep it simple unless we are forced to.
		uint32_t array_size = to_array_size_literal(lhs_type);
		chain.push_back(0);

		for (uint32_t i = 0; i < array_size; i++)
		{
			chain.back() = i;
			emit_copy_logical_type(lhs_id, lhs_type.parent_type, rhs_id, rhs_type.parent_type, chain);
		}
	}
	else if (lhs_type.basetype == SPIRType::Struct)
	{
		chain.push_back(0);
		uint32_t member_count = uint32_t(lhs_type.member_types.size());
		for (uint32_t i = 0; i < member_count; i++)
		{
			chain.back() = i;
			emit_copy_logical_type(lhs_id, lhs_type.member_types[i], rhs_id, rhs_type.member_types[i], chain);
		}
	}
	else
	{
		// Need to handle unpack/packing fixups since this can differ wildly between the logical types,
		// particularly in MSL.
		// To deal with this, we emit access chains and go through emit_store_statement
		// to deal with all the special cases we can encounter.

		AccessChainMeta lhs_meta, rhs_meta;
		auto lhs = access_chain_internal(lhs_id, chain.data(), uint32_t(chain.size()),
		                                 ACCESS_CHAIN_INDEX_IS_LITERAL_BIT, &lhs_meta);
		auto rhs = access_chain_internal(rhs_id, chain.data(), uint32_t(chain.size()),
		                                 ACCESS_CHAIN_INDEX_IS_LITERAL_BIT, &rhs_meta);

		uint32_t id = ir.increase_bound_by(2);
		lhs_id = id;
		rhs_id = id + 1;

		{
			auto &lhs_expr = set<SPIRExpression>(lhs_id, std::move(lhs), lhs_type_id, true);
			lhs_expr.need_transpose = lhs_meta.need_transpose;

			if (lhs_meta.storage_is_packed)
				set_extended_decoration(lhs_id, SPIRVCrossDecorationPhysicalTypePacked);
			if (lhs_meta.storage_physical_type != 0)
				set_extended_decoration(lhs_id, SPIRVCrossDecorationPhysicalTypeID, lhs_meta.storage_physical_type);

			forwarded_temporaries.insert(lhs_id);
			suppressed_usage_tracking.insert(lhs_id);
		}

		{
			auto &rhs_expr = set<SPIRExpression>(rhs_id, std::move(rhs), rhs_type_id, true);
			rhs_expr.need_transpose = rhs_meta.need_transpose;

			if (rhs_meta.storage_is_packed)
				set_extended_decoration(rhs_id, SPIRVCrossDecorationPhysicalTypePacked);
			if (rhs_meta.storage_physical_type != 0)
				set_extended_decoration(rhs_id, SPIRVCrossDecorationPhysicalTypeID, rhs_meta.storage_physical_type);

			forwarded_temporaries.insert(rhs_id);
			suppressed_usage_tracking.insert(rhs_id);
		}

		emit_store_statement(lhs_id, rhs_id);
	}
}